

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

ptr<asio_service>
nuraft::nuraft_global_mgr::init_asio_service
          (asio_service_options *asio_opt,ptr<logger> *logger_inst)

{
  pthread_mutex_t *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ptr<asio_service> pVar2;
  undefined1 auStack_38 [16];
  
  __mutex = (pthread_mutex_t *)get_instance();
  if (__mutex == (pthread_mutex_t *)0x0) {
    asio_opt->thread_pool_size_ = 0;
    *(undefined8 *)&(asio_opt->worker_start_).super__Function_base._M_functor = 0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    std::mutex::lock((mutex *)&__mutex->__data);
    if (__mutex[1].__align == 0) {
      std::
      make_shared<nuraft::asio_service,nuraft::asio_service_options_const&,std::shared_ptr<nuraft::logger>&>
                ((asio_service_options *)auStack_38,logger_inst);
      std::__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)
                 &__mutex[1].__data,
                 (__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)auStack_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
    }
    std::__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)asio_opt,
               (__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)&__mutex[1].__data)
    ;
    pthread_mutex_unlock(__mutex);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  pVar2.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)asio_opt;
  return (ptr<asio_service>)
         pVar2.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<asio_service> nuraft_global_mgr::init_asio_service
                  ( const asio_service_options& asio_opt,
                    ptr<logger> logger_inst )
{
    nuraft_global_mgr* mgr = get_instance();
    if (!mgr) return nullptr;

    std::lock_guard<std::mutex> l(mgr->asio_service_lock_);
    if (mgr->asio_service_) return mgr->asio_service_;

    mgr->asio_service_ = cs_new<asio_service>(asio_opt, logger_inst);
    return mgr->asio_service_;
}